

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void ev3dev::sound::tone(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *sequence,bool bSynchronous)

{
  pointer pvVar1;
  ostream *poVar2;
  bool bVar3;
  pointer __x;
  vector<float,_std::allocator<float>_> v;
  ostringstream args;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pvVar1 = (sequence->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (__x = (sequence->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_1c8,__x);
    if (!bVar3) {
      std::operator<<((ostream *)local_1a8," -n");
    }
    if ((pointer)local_1c8._M_string_length != local_1c8._M_dataplus._M_p) {
      poVar2 = std::operator<<((ostream *)local_1a8," -f ");
      std::ostream::operator<<(poVar2,*(float *)local_1c8._M_dataplus._M_p);
      if (4 < local_1c8._M_string_length - (long)local_1c8._M_dataplus._M_p) {
        poVar2 = std::operator<<((ostream *)local_1a8," -l ");
        std::ostream::operator<<(poVar2,*(float *)(local_1c8._M_dataplus._M_p + 4));
        if (8 < local_1c8._M_string_length - (long)local_1c8._M_dataplus._M_p) {
          poVar2 = std::operator<<((ostream *)local_1a8," -D ");
          std::ostream::operator<<(poVar2,*(float *)(local_1c8._M_dataplus._M_p + 8));
        }
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&local_1c8);
    bVar3 = false;
  }
  std::__cxx11::stringbuf::str();
  beep(&local_1c8,bSynchronous);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void sound::tone(
        const std::vector< std::vector<float> > &sequence,
        bool bSynchronous
        )
{
    std::ostringstream args;
    bool first = true;

    for(auto v : sequence) {
        if (first) {
            first = false;
        } else {
            args << " -n";
        }

        if (v.size() > 0) {
            args << " -f " << v[0];
        } else {
            continue;
        }

        if (v.size() > 1) {
            args << " -l " << v[1];
        } else {
            continue;
        }

        if (v.size() > 2) {
            args << " -D " << v[2];
        } else {
            continue;
        }
    }

    beep(args.str(), bSynchronous);
}